

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

void __thiscall rsg::VariableManager::popVariableScope(VariableManager *this)

{
  pointer *pppVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  VariableScope *pVVar4;
  long lVar5;
  iterator __position;
  pointer ppVVar6;
  ulong uVar7;
  Variable *liveVar;
  Variable *local_30;
  
  ppVVar2 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar3 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (long)ppVVar3 - (long)ppVVar2;
  if (8 < uVar7) {
    pVVar4 = ppVVar3[-1];
    ppVVar6 = (pVVar4->m_liveVariables).
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((pVVar4->m_liveVariables).
        super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppVVar6) {
      lVar5 = *(long *)((long)ppVVar2 + (uVar7 - 0x10));
      do {
        local_30 = ppVVar6[-1];
        __position._M_current = *(Variable ***)(lVar5 + 0x20);
        if (__position._M_current == *(Variable ***)(lVar5 + 0x28)) {
          std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
          _M_realloc_insert<rsg::Variable*const&>
                    ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)(lVar5 + 0x18),
                     __position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          *(long *)(lVar5 + 0x20) = *(long *)(lVar5 + 0x20) + 8;
        }
        ppVVar6 = (pVVar4->m_liveVariables).
                  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        (pVVar4->m_liveVariables).
        super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppVVar6;
      } while ((pVVar4->m_liveVariables).
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_start != ppVVar6);
    }
  }
  pppVVar1 = &(this->m_variableScopeStack).
              super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  *pppVVar1 = *pppVVar1 + -1;
  return;
}

Assistant:

void VariableManager::popVariableScope (void)
{
	VariableScope& curScope = getCurVariableScope();

	// Migrate live variables to parent scope.
	// Variables allocated in child scopes can be declared in any parent scope but not the other way around.
	if (m_variableScopeStack.size() > 1)
	{
		VariableScope&		parentScope		= *m_variableScopeStack[m_variableScopeStack.size()-2];
		vector<Variable*>&	curLiveVars		= curScope.getLiveVariables();
		vector<Variable*>&	parenLiveVars	= parentScope.getLiveVariables();

		while (!curLiveVars.empty())
		{
			Variable* liveVar = curLiveVars.back();
			parenLiveVars.push_back(liveVar);
			curLiveVars.pop_back();
		}
	}

	// All variables should be either migrated to parent or declared (in case of root scope).
	DE_ASSERT(curScope.getLiveVariables().size() == 0);

	m_variableScopeStack.pop_back();
}